

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O0

void __thiscall Guild::DelMember(Guild *this,string *kicked,Character *kicker,bool alert)

{
  World *pWVar1;
  __type _Var2;
  mapped_type *this_00;
  reference psVar3;
  element_type *__lhs;
  list<Client_*,_std::allocator<Client_*>_> *this_01;
  reference ppCVar4;
  vector<Character_*,_std::allocator<Character_*>_> *this_02;
  reference ppCVar5;
  undefined8 uVar6;
  bool bVar7;
  bool local_239;
  Database_Result local_238;
  Character *local_218;
  Character *character;
  iterator __end3;
  iterator __begin3;
  vector<Character_*,_std::allocator<Character_*>_> *__range3;
  EOClient *eoclient;
  Client *client;
  iterator __end1;
  iterator __begin1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  World *world;
  const_iterator local_1b8;
  undefined1 local_1b0 [8];
  shared_ptr<Guild_Member> member;
  __normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
  local_198;
  iterator it;
  string local_170;
  allocator local_149;
  string local_148;
  string local_128;
  string local_108 [32];
  string local_e8;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string msg;
  allocator local_69;
  key_type local_68;
  string local_48;
  byte local_21;
  Character *pCStack_20;
  bool alert_local;
  Character *kicker_local;
  string *kicked_local;
  Guild *this_local;
  
  local_21 = alert;
  pCStack_20 = kicker;
  kicker_local = (Character *)kicked;
  kicked_local = (string *)this;
  util::lowercase(&local_48,kicked);
  std::__cxx11::string::operator=((string *)kicked,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  msg.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
  super__Hash_node_code_cache<true>._M_hash_code._3_1_ = 0;
  bVar7 = (local_21 & 1) != 0;
  local_239 = false;
  if (bVar7) {
    pWVar1 = this->manager->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"GuildAnnounce",&local_69);
    msg.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
    super__Hash_node_code_cache<true>._M_hash_code._3_1_ = 1;
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](&(pWVar1->config).
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ,&local_68);
    local_239 = util::variant::operator_cast_to_bool(this_00);
  }
  if ((msg.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
       super__Hash_node_code_cache<true>._M_hash_code._3_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (bVar7) {
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  if (local_239 != false) {
    pWVar1 = this->manager->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"guild_leave",&local_c1);
    util::ucfirst(&local_e8,kicked);
    I18N::Format<std::__cxx11::string>((string *)local_a0,&pWVar1->i18n,&local_c0,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    if (pCStack_20 != (Character *)0x0) {
      pWVar1 = this->manager->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,"guild_kick",&local_149);
      util::ucfirst(&local_170,&pCStack_20->real_name);
      I18N::Format<std::__cxx11::string>(&local_128,&pWVar1->i18n,&local_148,&local_170);
      std::operator+((char *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34058e);
      std::__cxx11::string::operator+=((string *)local_a0,local_108);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
    }
    std::__cxx11::string::string((string *)&it,(string *)local_a0);
    Msg(this,(Character *)0x0,(string *)&it,true);
    std::__cxx11::string::~string((string *)&it);
    std::__cxx11::string::~string((string *)local_a0);
  }
  local_198._M_current =
       (shared_ptr<Guild_Member> *)
       std::
       begin<std::vector<std::shared_ptr<Guild_Member>,std::allocator<std::shared_ptr<Guild_Member>>>>
                 (&this->members);
  while( true ) {
    member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         end<std::vector<std::shared_ptr<Guild_Member>,std::allocator<std::shared_ptr<Guild_Member>>>>
                   (&this->members);
    bVar7 = __gnu_cxx::operator!=
                      (&local_198,
                       (__normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
                        *)&member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (!bVar7) break;
    psVar3 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
             ::operator*(&local_198);
    std::shared_ptr<Guild_Member>::shared_ptr((shared_ptr<Guild_Member> *)local_1b0,psVar3);
    __lhs = std::__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_1b0);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)kicked);
    if (_Var2) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Guild_Member>const*,std::vector<std::shared_ptr<Guild_Member>,std::allocator<std::shared_ptr<Guild_Member>>>>
      ::__normal_iterator<std::shared_ptr<Guild_Member>*>
                ((__normal_iterator<std::shared_ptr<Guild_Member>const*,std::vector<std::shared_ptr<Guild_Member>,std::allocator<std::shared_ptr<Guild_Member>>>>
                  *)&local_1b8,&local_198);
      std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
      erase(&this->members,local_1b8);
    }
    std::shared_ptr<Guild_Member>::~shared_ptr((shared_ptr<Guild_Member> *)local_1b0);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
    ::operator++(&local_198);
  }
  pWVar1 = this->manager->world;
  this_01 = &(pWVar1->server->super_Server).clients;
  __end1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(this_01);
  client = (Client *)std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(this_01);
  do {
    bVar7 = std::operator!=(&__end1,(_Self *)&client);
    if (!bVar7) {
      uVar6 = std::__cxx11::string::c_str();
      Database::Query(&local_238,&pWVar1->db,
                      "UPDATE `characters` SET `guild` = NULL, `guild_rank` = NULL, `guild_rank_string` = NULL WHERE `name` = \'$\'"
                      ,uVar6);
      Database_Result::~Database_Result(&local_238);
      return;
    }
    ppCVar4 = std::_List_iterator<Client_*>::operator*(&__end1);
    if ((*ppCVar4)[1].send_buffer.super__Hash_node_base._M_nxt != (_Hash_node_base *)0x0) {
      this_02 = (vector<Character_*,_std::allocator<Character_*>_> *)
                ((*ppCVar4)[1].send_buffer.super__Hash_node_base._M_nxt + 10);
      __end3 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(this_02);
      character = (Character *)std::vector<Character_*,_std::allocator<Character_*>_>::end(this_02);
      while (bVar7 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                         *)&character), bVar7) {
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                  ::operator*(&__end3);
        local_218 = *ppCVar5;
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_218->real_name,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )kicked);
        if (_Var2) {
          std::__shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>::reset
                    (&(local_218->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>);
          local_218->guild_rank = '\0';
          std::__cxx11::string::clear();
          if ((local_218->online & 1U) != 0) {
            return;
          }
          break;
        }
        __gnu_cxx::
        __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
        operator++(&__end3);
      }
    }
    std::_List_iterator<Client_*>::operator++(&__end1);
  } while( true );
}

Assistant:

void Guild::DelMember(std::string kicked, Character *kicker, bool alert)
{
	kicked = util::lowercase(kicked);

	if (alert && this->manager->world->config["GuildAnnounce"])
	{
		std::string msg = manager->world->i18n.Format("guild_leave", util::ucfirst(kicked));

		if (kicker)
			msg += " " + manager->world->i18n.Format("guild_kick", util::ucfirst(kicker->real_name));

		this->Msg(0, msg);
	}

	UTIL_IFOREACH(this->members, it)
	{
		std::shared_ptr<Guild_Member> member = *it;

		if (member->name == kicked)
		{
			this->members.erase(it);
			break;
		}
	}

	World* world = this->manager->world;

	UTIL_FOREACH(world->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->player)
		{
			UTIL_FOREACH(eoclient->player->characters, character)
			{
				if (character->real_name == kicked)
				{
					character->guild.reset();
					character->guild_rank = 0;
					character->guild_rank_string.clear();
					// *this may not be valid after this point

					if (character->online)
						return;
					else
						break;
				}
			}
		}
	}

	world->db.Query("UPDATE `characters` SET `guild` = NULL, `guild_rank` = NULL, `guild_rank_string` = NULL WHERE `name` = '$'", kicked.c_str());
}